

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrDestroyInstance(XrInstance instance)

{
  byte bVar1;
  char *pcVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  XrResult XVar5;
  __hash_code __code;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  XrGeneratedDispatchTable *table;
  string out;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  undefined1 local_70 [8];
  bool local_68;
  undefined7 uStack_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  XrInstance local_50;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],char_const(&)[18],char_const(&)[1]>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)&local_48,(char (*) [9])"XrResult",(char (*) [18])"xrDestroyInstance",
             (char (*) [1])0x2a4b54);
  local_70 = (undefined1  [8])&local_60;
  local_50 = instance;
  std::__cxx11::string::_M_construct((ulong)local_70,'\x12');
  *(char *)local_70 = '0';
  *(char *)((long)local_70 + 1) = 'x';
  pcVar2 = (char *)((long)local_70 + CONCAT71(uStack_67,local_68) + -1);
  lVar4 = 0;
  do {
    bVar1 = *(byte *)((long)&local_50 + lVar4);
    *pcVar2 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar2[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar4 = lVar4 + 1;
    pcVar2 = pcVar2 + -2;
  } while (lVar4 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)&local_48,(char (*) [11])"XrInstance",(char (*) [9])"instance",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_30,&local_48);
  ApiDumpLayerRecordContent(&local_30);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_30);
  local_70 = (undefined1  [8])&g_instance_dispatch_mutex;
  local_68 = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_70);
  local_68 = true;
  p_Var6 = g_instance_dispatch_map._M_h._M_buckets
           [(ulong)instance % g_instance_dispatch_map._M_h._M_bucket_count];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, (XrInstance)p_Var6->_M_nxt[1]._M_nxt != instance)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % g_instance_dispatch_map._M_h._M_bucket_count !=
           (ulong)instance % g_instance_dispatch_map._M_h._M_bucket_count) ||
         (p_Var7 = p_Var6, (XrInstance)p_Var3[1]._M_nxt == instance)) goto LAB_00105b77;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00105b77:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    table = (XrGeneratedDispatchTable *)p_Var3[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
  if (table == (XrGeneratedDispatchTable *)0x0) {
    XVar5 = XR_ERROR_HANDLE_INVALID;
  }
  else {
    (*table->DestroyInstance)(instance);
    ApiDumpCleanUpMapsForTable(table);
    XVar5 = XR_SUCCESS;
    if ((g_instance_dispatch_map._M_h._M_element_count == 0) &&
       (XVar5 = XR_SUCCESS, g_record_info.type == RECORD_HTML_FILE)) {
      ApiDumpLayerWriteHtmlFooter();
    }
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return XVar5;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrDestroyInstance(XrInstance instance) {
    // Generate output for this command
    std::vector<std::tuple<std::string, std::string, std::string>> contents;
    contents.emplace_back("XrResult", "xrDestroyInstance", "");
    contents.emplace_back("XrInstance", "instance", HandleToHexString(instance));
    ApiDumpLayerRecordContent(contents);

    XrGeneratedDispatchTable *next_dispatch = nullptr;
    {
        std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
        auto map_iter = g_instance_dispatch_map.find(instance);
        if (map_iter != g_instance_dispatch_map.end()) {
            next_dispatch = map_iter->second;
        }
    }

    if (nullptr == next_dispatch) {
        return XR_ERROR_HANDLE_INVALID;
    }

    next_dispatch->DestroyInstance(instance);
    ApiDumpCleanUpMapsForTable(next_dispatch);

    // Write out the HTML footer if we destroy the last instance
    if (g_instance_dispatch_map.empty() && g_record_info.type == RECORD_HTML_FILE) {
        ApiDumpLayerWriteHtmlFooter();
    }
    return XR_SUCCESS;
}